

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O0

string * __thiscall cppcms::session_interface::get_csrf_token_abi_cxx11_(session_interface *this)

{
  string *in_RDI;
  allocator local_69;
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  session_interface *in_stack_ffffffffffffffa8;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"_csrf",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff98,"",&local_69);
  get(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return in_RDI;
}

Assistant:

std::string session_interface::get_csrf_token()
{
	return get("_csrf","");
}